

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  Fault f;
  ulong local_40;
  ListElementCount local_34;
  
  uVar2 = expected._M_len;
  if (reader.builder.elementCount == uVar2) {
    if (uVar2 != 0) {
      uVar3 = 1;
      uVar1 = 0;
      do {
        f.exception._0_1_ = expected._M_array[uVar1];
        bVar4 = (reader.builder.ptr[uVar3 - 1 >> 3] >> (uVar3 - 1 & 7) & 1) != 0;
        local_40 = CONCAT71(local_40._1_7_,bVar4);
        if ((bVar4 != (bool)(char)f.exception) && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[28],bool&,bool&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(bool *)&f,(bool *)&local_40);
        }
        uVar1 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar1 < uVar2);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = uVar2;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}